

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

int __thiscall booster::aio::basic_socket::get_option(basic_socket *this,integer_option_type opt)

{
  int iVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar2 = get_option(this,opt,&e);
  iVar1 = e._M_value;
  if (e._M_value == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = iVar1;
  eVar3._M_cat = e._M_cat;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

int basic_socket::get_option(integer_option_type opt)
{
	system::error_code e;
	int res = get_option(opt,e);
	if(e) throw system::system_error(e);
	return res;
}